

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTestCase.cpp
# Opt level: O1

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::BlockReferencedByShaderValidator::
getHumanReadablePropertyString_abi_cxx11_(string *__return_storage_ptr__,void *this,GLint propVal)

{
  ostringstream s;
  Enum<int,_2UL> local_1a0;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  local_1a0.m_getName = glu::getBooleanName;
  local_1a0.m_value = propVal;
  std::__cxx11::ostringstream::ostringstream(local_190);
  tcu::Format::Enum<int,_2UL>::toStream(&local_1a0,(ostream *)local_190);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string BlockReferencedByShaderValidator::getHumanReadablePropertyString (glw::GLint propVal) const
{
	return de::toString(glu::getBooleanStr(propVal));
}